

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O2

void Abc_TtStoreWrite(char *pFileName,Abc_TtStore_t *p,int fBinary)

{
  int iVar1;
  FILE *__stream;
  int iVar2;
  long lVar3;
  char pBuffer [1000];
  
  iVar1 = p->nVars;
  __stream = fopen(pFileName,"wb");
  if (__stream != (FILE *)0x0) {
    iVar2 = 8 << ((char)iVar1 - 6U & 0x1f);
    if (iVar1 < 7) {
      iVar2 = 8;
    }
    for (lVar3 = 0; lVar3 < p->nFuncs; lVar3 = lVar3 + 1) {
      if (fBinary == 0) {
        Abc_TruthWriteHex((FILE *)__stream,p->pFuncs[lVar3],p->nVars);
        fwrite("    ",4,1,__stream);
        Dau_DsdDecompose(p->pFuncs[lVar3],p->nVars,0,(uint)(p->nVars < 0xb),pBuffer);
        fprintf(__stream,"%s\n",pBuffer);
      }
      else {
        fwrite(p->pFuncs[lVar3],(long)iVar2,1,__stream);
      }
    }
    fclose(__stream);
    return;
  }
  printf("Cannot open file \"%s\" for writing.\n",pFileName);
  return;
}

Assistant:

void Abc_TtStoreWrite( char * pFileName, Abc_TtStore_t * p, int fBinary )
{
    FILE * pFile;
    char pBuffer[1000];
    int i, nBytes = 8 * Abc_Truth6WordNum( p->nVars );
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    for ( i = 0; i < p->nFuncs; i++ )
    {
        if ( fBinary )
            fwrite( p->pFuncs[i], nBytes, 1, pFile );
        else
        {
            Abc_TruthWriteHex( pFile, p->pFuncs[i], p->nVars ), fprintf( pFile, "    " );
            Dau_DsdDecompose( p->pFuncs[i], p->nVars, 0, (int)(p->nVars <= 10), pBuffer );
            fprintf( pFile, "%s\n", pBuffer );
        }
    }
    fclose( pFile );
}